

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O2

vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> * __thiscall
myvk::BufferBase::GetSrcMemoryBarriers
          (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
           *__return_storage_ptr__,BufferBase *this,
          vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *regions,VkAccessFlags src_access_mask
          ,VkAccessFlags dst_access_mask,uint32_t src_queue_family,uint32_t dst_queue_family)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  VkBuffer pVVar4;
  uint uVar5;
  ulong uVar6;
  allocator_type local_39;
  BufferBase *local_38;
  
  local_38 = this;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (__return_storage_ptr__,
             ((long)(regions->super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(regions->super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x18,&local_39);
  pVVar1 = (regions->super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (regions->super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar3 = (__return_storage_ptr__->
           super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = local_38->m_buffer;
  for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < (ulong)(((long)pVVar2 - (long)pVVar1) / 0x18);
      uVar5 = uVar5 + 1) {
    pVVar3[uVar6].sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
    pVVar3[uVar6].size = pVVar1[uVar6].size;
    pVVar3[uVar6].buffer = pVVar4;
    pVVar3[uVar6].offset = pVVar1[uVar6].srcOffset;
    pVVar3[uVar6].srcAccessMask = src_access_mask;
    pVVar3[uVar6].dstAccessMask = dst_access_mask;
    pVVar3[uVar6].srcQueueFamilyIndex = src_queue_family;
    pVVar3[uVar6].dstQueueFamilyIndex = dst_queue_family;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkBufferMemoryBarrier> BufferBase::GetSrcMemoryBarriers(const std::vector<VkBufferCopy> &regions,
                                                                    VkAccessFlags src_access_mask,
                                                                    VkAccessFlags dst_access_mask,
                                                                    uint32_t src_queue_family,
                                                                    uint32_t dst_queue_family) const {
	std::vector<VkBufferMemoryBarrier> barriers(regions.size());
	for (uint32_t i = 0; i < regions.size(); ++i) {
		VkBufferMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
		cur.size = regions[i].size;

		cur.buffer = m_buffer;
		cur.offset = regions[i].srcOffset;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;
		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
	}
	return barriers;
}